

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O2

object_task<crnlib::dxt_hc> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::dxt_hc>,crnlib::dxt_hc*,void(crnlib::dxt_hc::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (crnlib *this,dxt_hc **init0,offset_in_dxt_hc_to_subr *init1,object_task_flags *init2)

{
  dxt_hc *pdVar1;
  dxt_hc *pdVar2;
  dxt_hc *pdVar3;
  offset_in_dxt_hc_to_subr oVar4;
  object_task<crnlib::dxt_hc> *poVar5;
  
  poVar5 = (object_task<crnlib::dxt_hc> *)crnlib_malloc(0x28);
  pdVar1 = *(dxt_hc **)this;
  oVar4 = *init1;
  (poVar5->super_executable_task)._vptr_executable_task = (_func_int **)&PTR_execute_task_001b99c0;
  pdVar2 = *init0;
  pdVar3 = init0[1];
  poVar5->m_pObject = pdVar1;
  poVar5->m_pMethod = (object_method_ptr)pdVar2;
  *(dxt_hc **)&poVar5->field_0x18 = pdVar3;
  poVar5->m_flags = (uint)oVar4;
  return poVar5;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2)
    {
        T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
        return new (static_cast<void*>(p)) T(init0, init1, init2);
    }